

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

int __thiscall
cmCTest::RunTest(cmCTest *this,vector<const_char_*,_std::allocator<const_char_*>_> *argv,
                string *output,int *retVal,ostream *log,double testTimeOut,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *environment,Encoding encoding)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  cmsysProcess *pcVar3;
  cmCTest *this_00;
  bool bVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  string *psVar8;
  pointer ppcVar9;
  SaveRestoreEnvironment *pSVar10;
  size_t sVar11;
  pointer __dest;
  ulong uVar12;
  undefined4 uVar13;
  undefined8 unaff_R13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  undefined8 extraout_XMM0_Qb;
  double dVar17;
  cmProcessOutput processOutput;
  vector<char,_std::allocator<char>_> tempOutput;
  auto_ptr<cmSystemTools::SaveRestoreEnvironment> saveEnv;
  int length;
  char *data;
  ostringstream msg;
  string strdata;
  ostringstream cmCTestLog_msg;
  undefined1 auStack_978 [15];
  cmProcessOutput local_969;
  string *local_968;
  ostream *local_960;
  vector<char,_std::allocator<char>_> local_958;
  auto_ptr<cmSystemTools::SaveRestoreEnvironment> local_938;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_930;
  int local_90c;
  cmsysProcess *local_908;
  undefined8 uStack_900;
  int *local_8f0;
  vector<char,_std::allocator<char>_> local_8e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_8c8;
  char *local_8c0;
  double local_8b8;
  undefined8 uStack_8b0;
  cmCTest *local_8a8;
  undefined1 local_8a0 [112];
  ios_base local_830 [264];
  string local_728;
  string local_708 [3];
  ios_base local_698 [264];
  undefined1 local_590 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_580 [6];
  ios_base local_520 [1016];
  double local_128;
  string *local_b0;
  string *local_a8;
  
  if (environment ==
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    uVar13 = 0;
  }
  else {
    uVar13 = (undefined4)
             CONCAT71((int7)((ulong)unaff_R13 >> 8),
                      (environment->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start !=
                      (environment->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish);
  }
  local_960 = (ostream *)testTimeOut;
  local_8f0 = retVal;
  local_8c8 = environment;
  dVar15 = GetRemainingTimeAllowed(this);
  dVar15 = dVar15 + -120.0;
  dVar16 = this->TimeOut;
  dVar17 = dVar16;
  if (dVar15 <= dVar16) {
    dVar17 = dVar15;
  }
  local_908 = (cmsysProcess *)
              (~-(ulong)(0.0 < dVar16) & (ulong)dVar15 | (ulong)dVar17 & -(ulong)(0.0 < dVar16));
  uStack_900 = extraout_XMM0_Qb;
  if ((0.0 < (double)local_960) &&
     (dVar16 = GetRemainingTimeAllowed(this), (double)local_960 < dVar16)) {
    local_908 = (cmsysProcess *)local_960;
    uStack_900 = 0;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_590);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_590,"Test timeout computed to be: ",0x1d);
  local_8b8 = (double)(~-(ulong)(0.0 < (double)local_908) & 0x3ff0000000000000 |
                      (ulong)local_908 & -(ulong)(0.0 < (double)local_908));
  uStack_8b0 = uStack_900;
  poVar7 = std::ostream::_M_insert<double>(local_8b8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  std::__cxx11::stringbuf::str();
  local_908 = (cmsysProcess *)CONCAT44(local_908._4_4_,uVar13);
  local_960 = log;
  Log(this,4,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x44a,local_708[0]._M_dataplus._M_p,false);
  paVar1 = &local_708[0].field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_708[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_708[0]._M_dataplus._M_p,
                    CONCAT71(local_708[0].field_2._M_allocated_capacity._1_7_,
                             local_708[0].field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_590);
  std::ios_base::~ios_base(local_520);
  std::__cxx11::string::string
            ((string *)local_590,
             *(argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
              super__Vector_impl_data._M_start,(allocator *)local_708);
  psVar8 = cmSystemTools::GetCTestCommand_abi_cxx11_();
  bVar4 = cmsys::SystemTools::SameFile((string *)local_590,psVar8);
  local_968 = output;
  if (bVar4) {
    bVar4 = this->ForceNewCTestProcess;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_590._0_8_ != local_580) {
      operator_delete((void *)local_590._0_8_,local_580[0]._M_allocated_capacity + 1);
    }
    if (bVar4 == false) {
      cmCTest((cmCTest *)local_590);
      std::__cxx11::string::_M_assign((string *)(local_590 + 8));
      local_128 = local_8b8;
      local_8a8 = this;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_708);
      local_958.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_958.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_958.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ppcVar9 = (argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      local_b0 = local_708;
      local_a8 = local_708;
      if ((argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
          super__Vector_impl_data._M_finish != ppcVar9) {
        pcVar2 = local_8a0 + 0x10;
        uVar12 = 0;
        uVar14 = 1;
        do {
          if (ppcVar9[uVar12] != (char *)0x0) {
            iVar5 = strcmp(ppcVar9[uVar12],"--build-generator");
            if ((0.0 < local_8b8) && (iVar5 == 0)) {
              local_8a0._0_8_ = pcVar2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_8a0,"--test-timeout","");
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_958,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_8a0);
              if ((char *)local_8a0._0_8_ != pcVar2) {
                operator_delete((void *)local_8a0._0_8_,local_8a0._16_8_ + 1);
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8a0);
              std::ostream::_M_insert<double>(local_8b8);
              std::__cxx11::stringbuf::str();
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_958,&local_930);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_930._M_dataplus._M_p != &local_930.field_2) {
                operator_delete(local_930._M_dataplus._M_p,
                                local_930.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8a0);
              std::ios_base::~ios_base(local_830);
            }
            std::__cxx11::string::string
                      ((string *)local_8a0,
                       (argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                       _M_impl.super__Vector_impl_data._M_start[uVar12],(allocator *)&local_930);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_958,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_8a0);
            if ((char *)local_8a0._0_8_ != pcVar2) {
              operator_delete((void *)local_8a0._0_8_,local_8a0._16_8_ + 1);
            }
          }
          ppcVar9 = (argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          bVar4 = uVar14 < (ulong)((long)(argv->
                                         super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar9
                                  >> 3);
          uVar12 = uVar14;
          uVar14 = (ulong)((int)uVar14 + 1);
        } while (bVar4);
      }
      poVar7 = local_960;
      if (local_960 != (ostream *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(local_960,"* Run internal CTest",0x14);
        std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
      }
      psVar8 = local_968;
      local_938.x_ = (SaveRestoreEnvironment *)0x0;
      if ((char)local_908 != '\0') {
        pSVar10 = (SaveRestoreEnvironment *)operator_new(0x18);
        cmSystemTools::SaveRestoreEnvironment::SaveRestoreEnvironment(pSVar10);
        ::cm::auto_ptr<cmSystemTools::SaveRestoreEnvironment>::reset(&local_938,pSVar10);
        cmSystemTools::AppendEnv(local_8c8);
      }
      iVar5 = Run((cmCTest *)local_590,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_958,psVar8);
      *local_8f0 = iVar5;
      if (psVar8 != (string *)0x0) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append((char *)psVar8,local_8a0._0_8_);
        if ((undefined1 *)local_8a0._0_8_ != local_8a0 + 0x10) {
          operator_delete((void *)local_8a0._0_8_,local_8a0._16_8_ + 1);
        }
      }
      if (poVar7 != (ostream *)0x0 && psVar8 != (string *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
      }
      this_00 = local_8a8;
      if (psVar8 != (string *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8a0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_8a0,"Internal cmCTest object used to run test.",0x29);
        std::ios::widen((char)(ostream *)local_8a0 + (char)*(undefined8 *)(local_8a0._0_8_ + -0x18))
        ;
        std::ostream::put((char)local_8a0);
        poVar7 = (ostream *)std::ostream::flush();
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
        std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(this_00,4,
            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
            ,0x479,local_930._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_930._M_dataplus._M_p != &local_930.field_2) {
          operator_delete(local_930._M_dataplus._M_p,local_930.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8a0);
        std::ios_base::~ios_base(local_830);
      }
      ::cm::auto_ptr<cmSystemTools::SaveRestoreEnvironment>::~auto_ptr(&local_938);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_958);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_708);
      std::ios_base::~ios_base(local_698);
      ~cmCTest((cmCTest *)local_590);
      return 4;
    }
  }
  else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_590._0_8_ != local_580) {
    operator_delete((void *)local_590._0_8_,local_580[0]._M_allocated_capacity + 1);
  }
  local_958.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_958.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_958.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (output != (string *)0x0) {
    std::__cxx11::string::_M_replace((ulong)output,0,(char *)output->_M_string_length,0x674b0e);
  }
  local_938.x_ = (SaveRestoreEnvironment *)0x0;
  if ((char)local_908 != '\0') {
    pSVar10 = (SaveRestoreEnvironment *)operator_new(0x18);
    cmSystemTools::SaveRestoreEnvironment::SaveRestoreEnvironment(pSVar10);
    ::cm::auto_ptr<cmSystemTools::SaveRestoreEnvironment>::reset(&local_938,pSVar10);
    cmSystemTools::AppendEnv(local_8c8);
  }
  local_908 = cmsysProcess_New();
  cmsysProcess_SetCommand
            (local_908,
             (argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
             super__Vector_impl_data._M_start);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_590);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_590,"Command is: ",0xc);
  pcVar2 = *(argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)auStack_978 + (int)*(undefined8 *)(local_590._0_8_ + -0x18) + 1000);
  }
  else {
    sVar11 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_590,pcVar2,sVar11);
  }
  std::ios::widen((char)(ostream *)local_590 + (char)*(undefined8 *)(local_590._0_8_ + -0x18));
  std::ostream::put((char)local_590);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x48b,local_708[0]._M_dataplus._M_p,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_708[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_708[0]._M_dataplus._M_p,
                    CONCAT71(local_708[0].field_2._M_allocated_capacity._1_7_,
                             local_708[0].field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_590);
  std::ios_base::~ios_base(local_520);
  pcVar3 = local_908;
  if (cmSystemTools::s_RunCommandHideConsole == true) {
    cmsysProcess_SetOption(local_908,0,1);
  }
  cmsysProcess_SetTimeout(pcVar3,local_8b8);
  cmsysProcess_Execute(pcVar3);
  cmProcessOutput::cmProcessOutput(&local_969,encoding,0x400);
  local_708[0]._M_string_length = 0;
  local_708[0].field_2._M_local_buf[0] = '\0';
  local_708[0]._M_dataplus._M_p = (pointer)paVar1;
  while (iVar5 = cmsysProcess_WaitForData(local_908,&local_8c0,&local_90c,(double *)0x0), iVar5 != 0
        ) {
    cmProcessOutput::DecodeText(&local_969,local_8c0,(long)local_90c,local_708,0);
    if (local_968 != (string *)0x0) {
      std::vector<char,std::allocator<char>>::_M_range_insert<char*>
                ((vector<char,std::allocator<char>> *)&local_958,
                 local_958.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish,local_8c0,local_8c0 + local_90c);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_590);
    if (local_708[0]._M_string_length != 0) {
      std::ostream::write((char *)local_590,(long)local_708[0]._M_dataplus._M_p);
      std::ostream::flush();
    }
    std::__cxx11::stringbuf::str();
    Log(this,4,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x49d,(char *)local_8a0._0_8_,false);
    if ((undefined1 *)local_8a0._0_8_ != local_8a0 + 0x10) {
      operator_delete((void *)local_8a0._0_8_,local_8a0._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_590);
    std::ios_base::~ios_base(local_520);
    if (local_960 != (ostream *)0x0) {
      std::ostream::write((char *)local_960,(long)local_708[0]._M_dataplus._M_p);
    }
  }
  local_728._M_string_length = 0;
  local_728.field_2._M_local_buf[0] = '\0';
  local_728._M_dataplus._M_p = (pointer)&local_728.field_2;
  cmProcessOutput::DecodeText(&local_969,&local_728,local_708,0);
  pcVar3 = local_908;
  poVar7 = local_960;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728._M_dataplus._M_p != &local_728.field_2) {
    operator_delete(local_728._M_dataplus._M_p,
                    CONCAT71(local_728.field_2._M_allocated_capacity._1_7_,
                             local_728.field_2._M_local_buf[0]) + 1);
  }
  if (local_708[0]._M_string_length != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_590);
    if (local_708[0]._M_string_length != 0) {
      std::ostream::write(local_590,(long)local_708[0]._M_dataplus._M_p);
      std::ostream::flush();
    }
    std::__cxx11::stringbuf::str();
    Log(this,4,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x4a5,(char *)local_8a0._0_8_,false);
    if ((undefined1 *)local_8a0._0_8_ != local_8a0 + 0x10) {
      operator_delete((void *)local_8a0._0_8_,local_8a0._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_590);
    std::ios_base::~ios_base(local_520);
    if (poVar7 != (ostream *)0x0) {
      std::ostream::write((char *)poVar7,(long)local_708[0]._M_dataplus._M_p);
    }
  }
  cmsysProcess_WaitForExit(pcVar3,(double *)0x0);
  local_8e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_8e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_8e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar12 = (long)local_958.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_958.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (uVar12 == 0) {
    __dest = (pointer)0x0;
  }
  else {
    if ((long)uVar12 < 0) {
      std::__throw_bad_alloc();
    }
    __dest = (pointer)operator_new(uVar12);
  }
  local_8e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = __dest + uVar12;
  sVar11 = (long)local_958.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_958.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_8e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = __dest;
  if (sVar11 != 0) {
    local_8e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = __dest;
    memmove(__dest,local_958.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar11);
  }
  local_8e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = __dest + sVar11;
  cmProcessOutput::DecodeText(&local_969,&local_8e8,&local_958,0);
  if (local_8e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_8e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_8e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_8e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((local_968 != (string *)0x0) &&
     (local_958.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_958.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    std::__cxx11::string::append
              ((char *)local_968,
               (ulong)local_958.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_590);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_590,"-- Process completed",0x14);
  std::ios::widen((char)(ostream *)local_590 + (char)*(undefined8 *)(local_590._0_8_ + -0x18));
  std::ostream::put((char)local_590);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(this,4,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x4b1,(char *)local_8a0._0_8_,false);
  if ((undefined1 *)local_8a0._0_8_ != local_8a0 + 0x10) {
    operator_delete((void *)local_8a0._0_8_,local_8a0._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_590);
  std::ios_base::~ios_base(local_520);
  iVar5 = cmsysProcess_GetState(pcVar3);
  if (iVar5 == 1) {
    local_8a0._0_8_ = local_8a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_8a0,"\n*** ERROR executing: ","");
    cmsysProcess_GetErrorString(pcVar3);
    std::__cxx11::string::append(local_8a0);
    if (local_968 != (string *)0x0) {
      std::__cxx11::string::_M_append((char *)local_968,local_8a0._0_8_);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_590);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_590,(char *)local_8a0._0_8_,local_8a0._8_8_);
    std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,4,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x4cd,local_930._M_dataplus._M_p,false);
  }
  else {
    if (iVar5 != 2) {
      if (iVar5 == 4) {
        iVar6 = cmsysProcess_GetExitValue(pcVar3);
        *local_8f0 = iVar6;
        if ((iVar6 != 0) && (this->OutputTestOutputOnTestFailure == true)) {
          OutputTestErrors(this,&local_958);
        }
      }
      goto LAB_0028c8d8;
    }
    if (this->OutputTestOutputOnTestFailure == true) {
      OutputTestErrors(this,&local_958);
    }
    iVar6 = cmsysProcess_GetExitException(pcVar3);
    *local_8f0 = iVar6;
    local_8a0._0_8_ = local_8a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_8a0,"\n*** Exception executing: ","");
    cmsysProcess_GetExceptionString(pcVar3);
    std::__cxx11::string::append(local_8a0);
    if (local_968 != (string *)0x0) {
      std::__cxx11::string::_M_append((char *)local_968,local_8a0._0_8_);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_590);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_590,(char *)local_8a0._0_8_,local_8a0._8_8_);
    std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,4,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x4c5,local_930._M_dataplus._M_p,false);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_930._M_dataplus._M_p != &local_930.field_2) {
    operator_delete(local_930._M_dataplus._M_p,local_930.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_590);
  std::ios_base::~ios_base(local_520);
  if ((undefined1 *)local_8a0._0_8_ != local_8a0 + 0x10) {
    operator_delete((void *)local_8a0._0_8_,local_8a0._16_8_ + 1);
  }
LAB_0028c8d8:
  cmsysProcess_Delete(pcVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_708[0]._M_dataplus._M_p != &local_708[0].field_2) {
    operator_delete(local_708[0]._M_dataplus._M_p,
                    CONCAT71(local_708[0].field_2._M_allocated_capacity._1_7_,
                             local_708[0].field_2._M_local_buf[0]) + 1);
  }
  cmProcessOutput::~cmProcessOutput(&local_969);
  ::cm::auto_ptr<cmSystemTools::SaveRestoreEnvironment>::~auto_ptr(&local_938);
  if (local_958.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_958.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_958.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_958.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar5;
}

Assistant:

int cmCTest::RunTest(std::vector<const char*> argv, std::string* output,
                     int* retVal, std::ostream* log, double testTimeOut,
                     std::vector<std::string>* environment, Encoding encoding)
{
  bool modifyEnv = (environment && !environment->empty());

  // determine how much time we have
  double timeout = this->GetRemainingTimeAllowed() - 120;
  if (this->TimeOut > 0 && this->TimeOut < timeout) {
    timeout = this->TimeOut;
  }
  if (testTimeOut > 0 && testTimeOut < this->GetRemainingTimeAllowed()) {
    timeout = testTimeOut;
  }

  // always have at least 1 second if we got to here
  if (timeout <= 0) {
    timeout = 1;
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
             "Test timeout computed to be: " << timeout << "\n");
  if (cmSystemTools::SameFile(argv[0], cmSystemTools::GetCTestCommand()) &&
      !this->ForceNewCTestProcess) {
    cmCTest inst;
    inst.ConfigType = this->ConfigType;
    inst.TimeOut = timeout;

    // Capture output of the child ctest.
    std::ostringstream oss;
    inst.SetStreams(&oss, &oss);

    std::vector<std::string> args;
    for (unsigned int i = 0; i < argv.size(); ++i) {
      if (argv[i]) {
        // make sure we pass the timeout in for any build and test
        // invocations. Since --build-generator is required this is a
        // good place to check for it, and to add the arguments in
        if (strcmp(argv[i], "--build-generator") == 0 && timeout > 0) {
          args.push_back("--test-timeout");
          std::ostringstream msg;
          msg << timeout;
          args.push_back(msg.str());
        }
        args.push_back(argv[i]);
      }
    }
    if (log) {
      *log << "* Run internal CTest" << std::endl;
    }

    CM_AUTO_PTR<cmSystemTools::SaveRestoreEnvironment> saveEnv;
    if (modifyEnv) {
      saveEnv.reset(new cmSystemTools::SaveRestoreEnvironment);
      cmSystemTools::AppendEnv(*environment);
    }

    *retVal = inst.Run(args, output);
    if (output) {
      *output += oss.str();
    }
    if (log && output) {
      *log << *output;
    }
    if (output) {
      cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                 "Internal cmCTest object used to run test." << std::endl
                                                             << *output
                                                             << std::endl);
    }

    return cmsysProcess_State_Exited;
  }
  std::vector<char> tempOutput;
  if (output) {
    *output = "";
  }

  CM_AUTO_PTR<cmSystemTools::SaveRestoreEnvironment> saveEnv;
  if (modifyEnv) {
    saveEnv.reset(new cmSystemTools::SaveRestoreEnvironment);
    cmSystemTools::AppendEnv(*environment);
  }

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, &*argv.begin());
  cmCTestLog(this, DEBUG, "Command is: " << argv[0] << std::endl);
  if (cmSystemTools::GetRunCommandHideConsole()) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  }

  cmsysProcess_SetTimeout(cp, timeout);
  cmsysProcess_Execute(cp);

  char* data;
  int length;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  while (cmsysProcess_WaitForData(cp, &data, &length, CM_NULLPTR)) {
    processOutput.DecodeText(data, length, strdata);
    if (output) {
      tempOutput.insert(tempOutput.end(), data, data + length);
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               cmCTestLogWrite(strdata.c_str(), strdata.size()));
    if (log) {
      log->write(strdata.c_str(), strdata.size());
    }
  }
  processOutput.DecodeText(std::string(), strdata);
  if (!strdata.empty()) {
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               cmCTestLogWrite(strdata.c_str(), strdata.size()));
    if (log) {
      log->write(strdata.c_str(), strdata.size());
    }
  }

  cmsysProcess_WaitForExit(cp, CM_NULLPTR);
  processOutput.DecodeText(tempOutput, tempOutput);
  if (output && tempOutput.begin() != tempOutput.end()) {
    output->append(&*tempOutput.begin(), tempOutput.size());
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, "-- Process completed"
               << std::endl);

  int result = cmsysProcess_GetState(cp);

  if (result == cmsysProcess_State_Exited) {
    *retVal = cmsysProcess_GetExitValue(cp);
    if (*retVal != 0 && this->OutputTestOutputOnTestFailure) {
      OutputTestErrors(tempOutput);
    }
  } else if (result == cmsysProcess_State_Exception) {
    if (this->OutputTestOutputOnTestFailure) {
      OutputTestErrors(tempOutput);
    }
    *retVal = cmsysProcess_GetExitException(cp);
    std::string outerr = "\n*** Exception executing: ";
    outerr += cmsysProcess_GetExceptionString(cp);
    if (output) {
      *output += outerr;
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, outerr << std::endl
                                                    << std::flush);
  } else if (result == cmsysProcess_State_Error) {
    std::string outerr = "\n*** ERROR executing: ";
    outerr += cmsysProcess_GetErrorString(cp);
    if (output) {
      *output += outerr;
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, outerr << std::endl
                                                    << std::flush);
  }
  cmsysProcess_Delete(cp);

  return result;
}